

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOrder.c
# Opt level: O0

void Aig_ObjOrderRemove(Aig_Man_t *p,int ObjId)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pObj;
  int iNext;
  int iPrev;
  int ObjId_local;
  Aig_Man_t *p_local;
  
  if (ObjId == 0) {
    __assert_fail("ObjId != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                  ,0x85,"void Aig_ObjOrderRemove(Aig_Man_t *, int)");
  }
  pObj = Aig_ManObj(p,ObjId);
  iVar3 = Aig_ObjIsNode(pObj);
  if (iVar3 != 0) {
    uVar1 = p->pOrderData[ObjId << 1];
    uVar2 = p->pOrderData[ObjId * 2 + 1];
    p->pOrderData[ObjId << 1] = 0xffffffff;
    p->pOrderData[ObjId * 2 + 1] = 0xffffffff;
    p->pOrderData[(int)(uVar2 << 1)] = uVar1;
    p->pOrderData[(int)(uVar1 * 2 + 1)] = uVar2;
    if (p->iPrev == ObjId) {
      p->nAndPrev = p->nAndPrev + -1;
      p->iPrev = uVar1;
    }
    if (p->iNext == ObjId) {
      p->iNext = uVar2;
    }
    p->nAndTotal = p->nAndTotal + -1;
    return;
  }
  __assert_fail("Aig_ObjIsNode( Aig_ManObj(p, ObjId) )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                ,0x86,"void Aig_ObjOrderRemove(Aig_Man_t *, int)");
}

Assistant:

void Aig_ObjOrderRemove( Aig_Man_t * p, int ObjId )
{
    int iPrev, iNext;
    assert( ObjId != 0 );
    assert( Aig_ObjIsNode( Aig_ManObj(p, ObjId) ) );
    iPrev = p->pOrderData[2*ObjId];
    iNext = p->pOrderData[2*ObjId+1];
    p->pOrderData[2*ObjId] = 0xFFFFFFFF;
    p->pOrderData[2*ObjId+1] = 0xFFFFFFFF;
    p->pOrderData[2*iNext] = iPrev;
    p->pOrderData[2*iPrev+1] = iNext;
    if ( p->iPrev == ObjId )
    {
        p->nAndPrev--;
        p->iPrev = iPrev;
    }
    if ( p->iNext == ObjId )
        p->iNext = iNext;
    p->nAndTotal--;
}